

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.h
# Opt level: O3

char * __thiscall Memory::NoCheckHeapAllocator::Alloc(NoCheckHeapAllocator *this,size_t byteSize)

{
  char *pcVar1;
  
  if (processHeap == (HANDLE)0x0) {
    processHeap = GetProcessHeap();
  }
  pcVar1 = (char *)HeapAlloc(processHeap,0,byteSize);
  if (pcVar1 == (char *)0x0) {
    DebugHeap_OOM_fatal_error();
  }
  return pcVar1;
}

Assistant:

char * Alloc(DECLSPEC_GUARD_OVERFLOW size_t byteSize)
    {
        if (processHeap == NULL)
        {
            processHeap = GetProcessHeap();
        }
        char * buffer = (char*)HeapAlloc(processHeap, 0, byteSize);
        if (buffer == nullptr)
        {
            // NoCheck heap allocator is only used by debug only code, and if we fail to allocate
            // memory, we will just raise an exception and kill the process
            DebugHeap_OOM_fatal_error();
        }
        return buffer;
    }